

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

void __thiscall
QSequentialAnimationGroupPrivate::setCurrentAnimation
          (QSequentialAnimationGroupPrivate *this,int index,bool intermediate)

{
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *this_00;
  QObject *this_01;
  parameter_type pQVar1;
  parameter_type pQVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = (this->super_QAnimationGroupPrivate).animations.d.size + -1;
  if (index <= lVar4) {
    lVar4 = (long)index;
  }
  iVar3 = (int)lVar4;
  if (iVar3 != -1) {
    this_01 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
              super_QObjectPrivate.super_QObjectData.q_ptr;
    if (this->currentAnimationIndex == iVar3) {
      pQVar2 = (this->super_QAnimationGroupPrivate).animations.d.ptr[lVar4];
      pQVar1 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
               ::value(&this->currentAnimation);
      if (pQVar2 == pQVar1) {
        return;
      }
    }
    this_00 = &this->currentAnimation;
    pQVar2 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
             ::value(this_00);
    if (pQVar2 != (parameter_type)0x0) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::value(this_00);
      QAbstractAnimation::stop
                ((QAbstractAnimation *)(this_00->super_QPropertyData<QAbstractAnimation_*>).val);
    }
    this->currentAnimationIndex = iVar3;
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::setValue(this_00,(this->super_QAnimationGroupPrivate).animations.d.ptr[lVar4]);
    pQVar2 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
             ::value(this_00);
    QSequentialAnimationGroup::currentAnimationChanged((QSequentialAnimationGroup *)this_01,pQVar2);
    activateCurrentAnimation(this,intermediate);
    return;
  }
  this->currentAnimationIndex = -1;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  ::setValue(&this->currentAnimation,(parameter_type)0x0);
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::setCurrentAnimation(int index, bool intermediate)
{
    Q_Q(QSequentialAnimationGroup);
    // currentAnimation.removeBindingUnlessInWrapper()
    // is not necessary here, since it is read only

    index = qMin(index, animations.size() - 1);

    if (index == -1) {
        Q_ASSERT(animations.isEmpty());
        currentAnimationIndex = -1;
        currentAnimation = nullptr;
        return;
    }

    // need these two checks below because this func can be called after the current animation
    // has been removed
    if (index == currentAnimationIndex && animations.at(index) == currentAnimation)
        return;

    // stop the old current animation
    if (currentAnimation)
        currentAnimation->stop();

    currentAnimationIndex = index;
    currentAnimation = animations.at(index);

    emit q->currentAnimationChanged(currentAnimation);

    activateCurrentAnimation(intermediate);
}